

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pole_zero_filter.cc
# Opt level: O1

PoleZeroFilter *
webrtc::PoleZeroFilter::Create
          (float *numerator_coefficients,size_t order_numerator,float *denominator_coefficients,
          size_t order_denominator)

{
  PoleZeroFilter *this;
  
  if (order_denominator < 0x19 && order_numerator < 0x19) {
    this = (PoleZeroFilter *)0x0;
    if ((numerator_coefficients != (float *)0x0) &&
       ((*denominator_coefficients != 0.0 || (NAN(*denominator_coefficients))))) {
      this = (PoleZeroFilter *)operator_new(0x200);
      PoleZeroFilter(this,numerator_coefficients,order_numerator,denominator_coefficients,
                     order_denominator);
    }
  }
  else {
    this = (PoleZeroFilter *)0x0;
  }
  return this;
}

Assistant:

PoleZeroFilter* PoleZeroFilter::Create(const float* numerator_coefficients,
                                       size_t order_numerator,
                                       const float* denominator_coefficients,
                                       size_t order_denominator) {
  if (order_numerator > kMaxFilterOrder ||
      order_denominator > kMaxFilterOrder || denominator_coefficients[0] == 0 ||
      numerator_coefficients == NULL || denominator_coefficients == NULL)
    return NULL;
  return new PoleZeroFilter(numerator_coefficients, order_numerator,
                            denominator_coefficients, order_denominator);
}